

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::ClangShellCommand::getVerboseDescription
          (ClangShellCommand *this,SmallVectorImpl<char> *result)

{
  bool bVar1;
  bool bVar2;
  reference pSVar3;
  StringRef string;
  StringRef *arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  undefined1 local_48 [7];
  bool first;
  raw_svector_ostream os;
  SmallVectorImpl<char> *result_local;
  ClangShellCommand *this_local;
  
  os.OS = result;
  llvm::raw_svector_ostream::raw_svector_ostream((raw_svector_ostream *)local_48,result);
  bVar1 = true;
  __end2 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin(&this->args);
  arg = (StringRef *)
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end(&this->args);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                *)&arg);
    if (!bVar2) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
             ::operator*(&__end2);
    if (!bVar1) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_48," ");
    }
    bVar1 = false;
    string.Length = (size_t)pSVar3->Data;
    string.Data = (char *)pSVar3->Length;
    llbuild::basic::appendShellEscapedString((basic *)local_48,(raw_ostream *)pSVar3->Data,string);
    __gnu_cxx::
    __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
    ::operator++(&__end2);
  }
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_48);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: args) {
      if (!first) os << " ";
      first = false;
      basic::appendShellEscapedString(os, arg);
    }
  }